

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O2

void pre_process_data(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                     JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr,
                     JDIMENSION out_row_groups_avail)

{
  jpeg_c_prep_controller *pjVar1;
  uint uVar2;
  JDIMENSION JVar3;
  jpeg_c_prep_controller *pjVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  
  pjVar4 = cinfo->prep;
  do {
    uVar2 = *in_row_ctr;
    if (in_rows_avail <= uVar2) {
      return;
    }
    if (out_row_groups_avail <= *out_row_group_ctr) {
      return;
    }
    JVar3 = *(JDIMENSION *)((long)&pjVar4[6].start_pass + 4);
    uVar6 = cinfo->max_v_samp_factor - JVar3;
    if (in_rows_avail - uVar2 <= uVar6) {
      uVar6 = in_rows_avail - uVar2;
    }
    (*cinfo->cconvert->color_convert)(cinfo,input_buf + uVar2,(JSAMPIMAGE)(pjVar4 + 1),JVar3,uVar6);
    *in_row_ctr = *in_row_ctr + uVar6;
    iVar5 = *(int *)((long)&pjVar4[6].start_pass + 4) + uVar6;
    *(int *)((long)&pjVar4[6].start_pass + 4) = iVar5;
    pjVar1 = pjVar4 + 6;
    *(uint *)&pjVar1->start_pass = *(int *)&pjVar1->start_pass - uVar6;
    if (iVar5 < cinfo->max_v_samp_factor && *(int *)&pjVar1->start_pass == 0) {
      for (lVar7 = 0; lVar7 < cinfo->num_components; lVar7 = lVar7 + 1) {
        expand_bottom_edge((JSAMPARRAY)(&pjVar4[1].start_pass)[lVar7],cinfo->image_width,
                           *(int *)((long)&pjVar4[6].start_pass + 4),cinfo->max_v_samp_factor);
      }
      *(int *)((long)&pjVar4[6].start_pass + 4) = cinfo->max_v_samp_factor;
LAB_0010f3af:
      (*cinfo->downsample->downsample)
                (cinfo,(JSAMPIMAGE)(pjVar4 + 1),0,output_buf,*out_row_group_ctr);
      *(undefined4 *)((long)&pjVar4[6].start_pass + 4) = 0;
      *out_row_group_ctr = *out_row_group_ctr + 1;
    }
    else if (iVar5 == cinfo->max_v_samp_factor) goto LAB_0010f3af;
    if ((*(int *)&pjVar4[6].start_pass == 0) && (*out_row_group_ctr < out_row_groups_avail)) {
      piVar8 = &cinfo->comp_info->DCT_v_scaled_size;
      for (lVar7 = 0; lVar7 < cinfo->num_components; lVar7 = lVar7 + 1) {
        iVar5 = (*piVar8 * piVar8[-7]) / cinfo->min_DCT_v_scaled_size;
        expand_bottom_edge(output_buf[lVar7],piVar8[-1] * piVar8[-3],*out_row_group_ctr * iVar5,
                           iVar5 * out_row_groups_avail);
        piVar8 = piVar8 + 0x18;
      }
      *out_row_group_ctr = out_row_groups_avail;
      return;
    }
  } while( true );
}

Assistant:

METHODDEF(void)
pre_process_data (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		  JDIMENSION in_rows_avail,
		  JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		  JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  JDIMENSION inrows;
  jpeg_component_info * compptr;

  while (*in_row_ctr < in_rows_avail &&
	 *out_row_group_ctr < out_row_groups_avail) {
    /* Do color conversion to fill the conversion buffer. */
    inrows = in_rows_avail - *in_row_ctr;
    numrows = cinfo->max_v_samp_factor - prep->next_buf_row;
    numrows = (int) MIN((JDIMENSION) numrows, inrows);
    (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
				       prep->color_buf,
				       (JDIMENSION) prep->next_buf_row,
				       numrows);
    *in_row_ctr += numrows;
    prep->next_buf_row += numrows;
    prep->rows_to_go -= numrows;
    /* If at bottom of image, pad to fill the conversion buffer. */
    if (prep->rows_to_go == 0 &&
	prep->next_buf_row < cinfo->max_v_samp_factor) {
      for (ci = 0; ci < cinfo->num_components; ci++) {
	expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			   prep->next_buf_row, cinfo->max_v_samp_factor);
      }
      prep->next_buf_row = cinfo->max_v_samp_factor;
    }
    /* If we've filled the conversion buffer, empty it. */
    if (prep->next_buf_row == cinfo->max_v_samp_factor) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf, (JDIMENSION) 0,
					output_buf, *out_row_group_ctr);
      prep->next_buf_row = 0;
      (*out_row_group_ctr)++;
    }
    /* If at bottom of image, pad the output to a full iMCU height.
     * Note we assume the caller is providing a one-iMCU-height output buffer!
     */
    if (prep->rows_to_go == 0 &&
	*out_row_group_ctr < out_row_groups_avail) {
      for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	   ci++, compptr++) {
	numrows = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
	expand_bottom_edge(output_buf[ci],
			   compptr->width_in_blocks * compptr->DCT_h_scaled_size,
			   (int) (*out_row_group_ctr * numrows),
			   (int) (out_row_groups_avail * numrows));
      }
      *out_row_group_ctr = out_row_groups_avail;
      break;			/* can exit outer loop without test */
    }
  }
}